

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O1

void __thiscall
neural_networks::NeuralNetwork::back_propogate
          (NeuralNetwork *this,vector<long_double,_std::allocator<long_double>_> *correct_data)

{
  longdouble lVar1;
  pointer ppNVar2;
  pointer pvVar3;
  pointer pvVar4;
  long lVar5;
  size_t sVar6;
  NeuralLayer *pNVar7;
  NeuralMatrix *pNVar8;
  size_t sVar9;
  int iVar10;
  Matrix<long_double> *pMVar11;
  longdouble *plVar12;
  undefined4 extraout_var;
  length_error *this_00;
  long lVar13;
  Matrix<long_double> **item;
  pointer ppMVar14;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  undefined8 *puVar18;
  longdouble lVar19;
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  error_vectors;
  allocator_type local_59;
  vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
  local_58;
  Matrix<long_double> *local_40;
  value_type local_38;
  
  ppNVar2 = (this->layers).
            super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4 ==
      (ppNVar2[-1]->data->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    local_38 = (value_type)0x0;
    std::
    vector<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
    ::vector(&local_58,
             (long)ppNVar2 -
             (long)(this->layers).
                   super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_59);
    pMVar11 = utilities::matrix_operators::create
                        ((this->layers).
                         super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->data,function);
    local_58.
    super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1] = pMVar11;
    plVar12 = (correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar13 = (long)(correct_data->super__Vector_base<long_double,_std::allocator<long_double>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar12;
    if (lVar13 != 0) {
      lVar13 = lVar13 >> 4;
      pvVar3 = ((this->layers).
                super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->data->
               super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
               super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (local_58.
                super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->matrix).
               super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      lVar16 = 0;
      do {
        lVar5 = **(long **)((long)&(pvVar3->
                                   super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar16);
        **(longdouble **)
          ((long)&(pvVar4->super__Vector_base<long_double,_std::allocator<long_double>_>)._M_impl.
                  super__Vector_impl_data._M_start + lVar16) =
             *(longdouble *)(lVar5 + 0x30) * (*(longdouble *)(lVar5 + 0x20) - *plVar12);
        lVar16 = lVar16 + 0x18;
        plVar12 = plVar12 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    for (lVar13 = ((long)local_58.
                         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.
                         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) + -2; lVar13 != 0;
        lVar13 = lVar13 + -1) {
      iVar10 = (*(this->layers).
                 super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar13 + 1]->weights->_vptr_Matrix[2])();
      pMVar11 = utilities::Matrix<long_double>::operator*
                          ((Matrix<long_double> *)CONCAT44(extraout_var,iVar10),
                           local_58.
                           super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar13 + 1]);
      sVar6 = pMVar11->N;
      if (sVar6 != 0) {
        ppNVar2 = (this->layers).
                  super__Vector_base<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pNVar7 = ppNVar2[lVar13];
        lVar16 = *(long *)&(pNVar7->data->super_Matrix<neural_networks::utilities::Neuron_*>).matrix
                           .
                           super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        pvVar4 = (pMVar11->matrix).
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = *(long *)&(pNVar7->bias->matrix).
                          super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        pNVar8 = ppNVar2[lVar13 + -1]->data;
        sVar9 = (pNVar8->super_Matrix<neural_networks::utilities::Neuron_*>).N;
        sVar17 = 0;
        do {
          lVar1 = this->learning_rate;
          plVar12 = pvVar4[sVar17].super__Vector_base<long_double,_std::allocator<long_double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar19 = *plVar12 * *(longdouble *)(**(long **)(lVar16 + sVar17 * 0x18) + 0x30);
          *plVar12 = lVar19;
          lVar19 = lVar19 * lVar1;
          plVar12 = *(longdouble **)(lVar5 + sVar17 * 0x18);
          *plVar12 = *plVar12 - lVar19;
          if (sVar9 != 0) {
            puVar18 = *(undefined8 **)
                       &(pNVar8->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                        super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                        ._M_impl.super__Vector_impl_data;
            plVar12 = *(longdouble **)
                       (*(long *)&(pNVar7->weights->matrix).
                                  super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                  ._M_impl.super__Vector_impl_data + sVar17 * 0x18);
            sVar15 = sVar9;
            do {
              *plVar12 = *plVar12 - *(longdouble *)(*(long *)*puVar18 + 0x10) * lVar19;
              puVar18 = puVar18 + 3;
              plVar12 = plVar12 + 1;
              sVar15 = sVar15 - 1;
            } while (sVar15 != 0);
          }
          sVar17 = sVar17 + 1;
        } while (sVar17 != sVar6);
      }
      local_40 = (Matrix<long_double> *)CONCAT44(extraout_var,iVar10);
      (*pMVar11->_vptr_Matrix[5])(pMVar11);
      local_58.
      super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar13] = pMVar11;
      (*local_40->_vptr_Matrix[4])();
    }
    ppMVar14 = local_58.
               super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (*local_58.
         super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_start != (Matrix<long_double> *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: the 0th index of error_vector non-null\n",0x2e);
      ppMVar14 = local_58.
                 super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; ppMVar14 !=
           local_58.
           super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppMVar14 = ppMVar14 + 1) {
      if (*ppMVar14 != (Matrix<long_double> *)0x0) {
        (*(*ppMVar14)->_vptr_Matrix[4])();
      }
    }
    if (local_58.
        super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<neural_networks::utilities::Matrix<long_double>_*,_std::allocator<neural_networks::utilities::Matrix<long_double>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,"Length of given dataset doesn\'t match up with output layer");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void NeuralNetwork::back_propogate(const std::vector<long double> &correct_data) const {
    // check to see if the given data set matches the size of the output vector
    if(correct_data.size() != layers[layers.size() - 1] -> data -> N) {
        throw std::length_error("Length of given dataset doesn't match up with output layer");
    }

    /* we need to amortize the error so we can quickly look it up later
    * the size that will actually be in use is layers.size() - 1 in practice but it makes it easier to access
    * I don't think there's any real reason to keep a vector of all the error vectors, since realistically
    * you're only going to be accessing the last ones, but it's nice to keep a reference of them anyway.
    * At some point the NeuralMatrix pointer will become a smart pointer and I'll be able to return these
    * without getting a bunch of cloggged up memory */
    std::vector< utilities::Matrix<long double> *> error_vectors(layers.size(), nullptr);
    // should create a copy of the last layer (output)
    // initialize last error vector to contain the values of the data vector's function
    error_vectors[error_vectors.size() - 1] =
            utilities::matrix_operators::create(layers[layers.size() - 1] -> data,
                                                utilities::matrix_operators::function);


    // data.size = length of output layer

    // loop creates the correct values for the error vector at the end
    for(register size_t i = 0; i < correct_data.size(); ++i) {
        error_vectors[error_vectors.size() - 1] -> matrix[i][0] =
                (layers[layers.size() - 1] -> data -> matrix[i][0] -> function - correct_data[i]) *
                layers[layers.size() - 1] -> data -> matrix[i][0] -> function_derivative;
    }
    utilities::Matrix<long double> *temp = NULL, *wt = NULL;
    long double del = 0;
    register size_t i = 0, j = 0, k = 0;
    // this loop performs the routine delta(l) = ((transpose(weight(l+1)) * delta(l+1)) * sigma'(z(l))
    for(i = error_vectors.size() - 2; i != 0; --i) {
        // here we have to get a copy of the transpose matrix
        wt = layers[i + 1] -> weights -> transpose();

        // this performs the matrix multiplication of weight(l+1)^T * delta(l+1)
        temp = *wt * error_vectors[i + 1];

        /* now that we have completed the matrix multiplication we'll need to actually compute the
         * element-wise product for ((w(l+1)^T) * delta(l+1)) (x) sigma'(z'(l)) */
        for(j = 0; j < temp -> N; ++j) {

            /* we'll set each individual element equal to the element wise product of the lefthand side and righthand
             * side of what should be two column vectors, we will update that value, save it, and then multiply it
             * by the learning rate, and save that as our del. This is what we'll subtract from the bias vector and
             * the weights matrix in order to back-propogate correctly
             */
            del = learning_rate * (temp -> matrix[j][0] *=
                                           layers[i] -> data -> matrix[j][0] -> function_derivative);
            // subtract the delta from the bias
            layers[i] -> bias -> matrix[j][0]-= del;
            // for the weight matrix, it's dC/d(w^(l)_{j,k}) = a^(l-1)_k * del(l)_j, so we have to multiply through
            // each value in order to update the weights matrix
            for(k = 0; k < layers[i - 1] -> data -> N; ++k) {
                layers[i] -> weights -> matrix[j][k] -= layers[i - 1] -> data -> matrix[k][0] -> data * del;
            }
        }
        temp -> print();
        /* finally, since we're done computing the hadamard product of the lefthand side and the righthand side
         * we place the temp pointer in our actual error_vectors vector and delete the transpose we used
         */
        error_vectors[i] = temp;
        delete wt;
    }
    // to make sure this works correctly
    if(error_vectors[0] != nullptr) {
        std::cerr << "Error: the 0th index of error_vector non-null\n";
    }

    for(auto& item : error_vectors) {
        delete item;
    }
}